

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_filter.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  uint32_t uVar2;
  int __fd;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  void *__addr;
  clock_t cVar9;
  uchar *md;
  size_t n;
  size_t n_00;
  char **in_RSI;
  uchar *d;
  uint32_t *d_00;
  int in_EDI;
  clock_t end;
  xor8_t filter_1;
  MappeableBloomFilter<12> filter;
  uint8_t *addr;
  bool shared;
  int fd;
  bool isok_1;
  bool isok;
  binary_fuse16_t binfilter16;
  binary_fuse8_t binfilter;
  size_t length;
  bool bloom12;
  bool bin16;
  bool xor8;
  FILE *fp;
  clock_t start;
  uint64_t BlockLength;
  uint64_t seed;
  uint64_t cookie;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  char *hashhex;
  char tmp [48];
  uint32_t digest [5];
  char *tobehashed;
  SHA1 s;
  uint64_t hexval;
  char *filename;
  bool shaourinput;
  int c;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  uint32_t *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  binary_fuse16_t *in_stack_fffffffffffffde8;
  binary_fuse16_t *in_stack_fffffffffffffdf0;
  uint64_t in_stack_fffffffffffffe00;
  MappeableBloomFilter<12> *in_stack_fffffffffffffe08;
  undefined1 auStack_1a0 [4];
  undefined1 auStack_19c [4];
  undefined1 auStack_198 [4];
  undefined1 auStack_194 [4];
  uint local_190 [2];
  long local_188;
  undefined8 local_180;
  undefined1 auStack_178 [4];
  undefined1 auStack_174 [4];
  undefined1 auStack_170 [4];
  undefined1 auStack_16c [4];
  uint local_168 [2];
  long local_160;
  size_t local_158;
  byte local_14b;
  byte local_14a;
  byte local_149;
  FILE *local_148;
  clock_t local_140;
  long local_138;
  undefined8 local_130;
  long local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  uint8_t *local_100;
  uint32_t local_f8 [12];
  uint local_c8;
  uint local_c4;
  uint local_c0;
  undefined4 local_bc;
  undefined4 local_b8;
  binary_fuse16_t *local_a0;
  SHA1 local_98;
  ulong local_28;
  uchar *local_20;
  byte local_15;
  int local_14;
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_15 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_14 = getopt(local_8,local_10,"hs"), local_14 != -1) {
    if (local_14 == 0x68) {
      printusage((char *)0x10129d);
      return 0;
    }
    if (local_14 != 0x73) {
      printusage((char *)0x1012c7);
      return 0;
    }
    local_15 = 1;
    local_14 = 0x73;
  }
  if (local_8 <= _optind + 1) {
    printusage((char *)0x101301);
    return -1;
  }
  md = (uchar *)(long)_optind;
  d = (uchar *)local_10[(long)md];
  local_20 = d;
  printf("using database: %s\n");
  if ((local_15 & 1) == 0) {
    local_100 = (uint8_t *)local_10[_optind + 1];
    sVar3 = strlen((char *)local_100);
    if (sVar3 != 0x10) {
      sVar3 = strlen((char *)local_100);
      printf("bad hex. length is %zu, 16 hexadecimal characters expected.\n",sVar3);
      printusage((char *)0x10151e);
      return 1;
    }
    uVar2 = hex_to_u32_nocheck(local_100);
    local_108 = (ulong)uVar2;
    uVar2 = hex_to_u32_nocheck(local_100 + 4);
    local_110 = (ulong)uVar2;
    uVar2 = hex_to_u32_nocheck(local_100 + 8);
    local_118 = (ulong)uVar2;
    uVar2 = hex_to_u32_nocheck(local_100 + 0xc);
    local_120 = (ulong)uVar2;
    if (0xffff < (local_108 | local_110 | local_118 | local_120)) {
      printf("bad hex value  %s \n",local_100);
      return 1;
    }
    local_28 = local_108 << 0x30 | local_110 << 0x20 | local_118 << 0x10 | local_120;
  }
  else {
    printf("We are going to hash your input.\n");
    sha1::SHA1::SHA1(&local_98,d,n,md);
    in_stack_fffffffffffffdf0 = (binary_fuse16_t *)local_10[(long)_optind + 1];
    local_a0 = in_stack_fffffffffffffdf0;
    sVar3 = strlen((char *)in_stack_fffffffffffffdf0);
    printf("hashing this word: %s (length in bytes = %zu)\n",in_stack_fffffffffffffdf0,sVar3);
    in_stack_fffffffffffffde8 = local_a0;
    strlen((char *)local_a0);
    sha1::SHA1::processBytes
              ((SHA1 *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8,
               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    sha1::SHA1::getDigest
              ((SHA1 *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffde7 = 0;
    d_00 = local_f8;
    snprintf((char *)d_00,0x2d,"%08x %08x %08x %08x %08x",(ulong)local_c8,(ulong)local_c4,
             (ulong)local_c0);
    in_stack_fffffffffffffdd8 = d_00;
    printf("SHA1 hash %s\n");
    local_28 = CONCAT44(local_c8,local_c4);
    sha1::SHA1::~SHA1(&local_98,(uchar *)d_00,n_00,(uchar *)(ulong)local_c4);
    in_stack_fffffffffffffdc8 = local_bc;
    in_stack_fffffffffffffdd0 = local_b8;
  }
  printf("hexval = 0x%lx\n",local_28);
  local_128 = 0;
  local_130 = 0;
  local_138 = 0;
  local_140 = clock();
  local_148 = fopen((char *)local_20,"rb");
  if (local_148 == (FILE *)0x0) {
    printf("Cannot read the input file %s.",local_20);
    local_4 = 1;
  }
  else {
    local_149 = 0;
    local_14a = 0;
    local_14b = 0;
    sVar3 = fread(&local_128,8,1,local_148);
    if (sVar3 != 1) {
      printf("failed read.\n");
    }
    sVar3 = fread(&local_130,8,1,local_148);
    if (sVar3 != 1) {
      printf("failed read.\n");
    }
    if (local_128 != 0x12d689) {
      if (local_128 == 0x12d68a) {
        local_14a = 1;
      }
      else if (local_128 == 0x12d687) {
        local_149 = 1;
        sVar3 = fread(&local_138,8,1,local_148);
        if (sVar3 != 1) {
          printf("failed read.\n");
        }
      }
      else {
        if (local_128 != 0x12d688) {
          printf("Not a filter file. Cookie found: %llu.\n",local_128);
          return 1;
        }
        local_14b = 1;
        sVar3 = fread(&local_138,8,1,local_148);
        if (sVar3 != 1) {
          printf("failed read.\n");
        }
      }
    }
    local_158 = 0;
    if ((local_14b & 1) == 0) {
      if ((local_149 & 1) == 0) {
        if ((local_14a & 1) == 0) {
          local_180 = local_130;
          sVar3 = fread(auStack_178,4,1,local_148);
          sVar4 = fread(auStack_174,4,1,local_148);
          sVar5 = fread(auStack_170,4,1,local_148);
          sVar6 = fread(auStack_16c,4,1,local_148);
          sVar7 = fread(local_168,4,1,local_148);
          if ((((((sVar3 & 1) != 0 & sVar4) != 0 & sVar5) != 0 & sVar6) != 0 & sVar7) == 0) {
            printf("failed read.\n");
          }
          uVar8 = (ulong)local_168[0];
        }
        else {
          sVar3 = fread(auStack_1a0,4,1,local_148);
          sVar4 = fread(auStack_19c,4,1,local_148);
          sVar5 = fread(auStack_198,4,1,local_148);
          sVar6 = fread(auStack_194,4,1,local_148);
          sVar7 = fread(local_190,4,1,local_148);
          if ((((((sVar3 & 1) != 0 & sVar4) != 0 & sVar5) != 0 & sVar6) != 0 & sVar7) == 0) {
            printf("failed read.\n");
          }
          uVar8 = (ulong)local_190[0] * 2;
        }
        local_158 = uVar8 + 0x24;
      }
      else {
        local_158 = local_138 * 3 + 0x18;
      }
    }
    else {
      local_158 = local_138 * 8 + 0x18;
    }
    if ((local_14b & 1) == 0) {
      if ((local_149 & 1) == 0) {
        if ((local_14a & 1) == 0) {
          printf("8-bit binary fuse filter detected.\n");
        }
        else {
          printf("16-bit binary fuse filter detected.\n");
        }
      }
      else {
        printf("Xor filter detected.\n");
      }
    }
    else {
      printf("Bloom filter detected.\n");
    }
    fclose(local_148);
    __fd = open((char *)local_20,0);
    printf("I expect the file to span %zu bytes.\n",local_158);
    __addr = mmap((void *)0x0,local_158,1,2,__fd,0);
    if (__addr == (void *)0xffffffffffffffff) {
      printf("Data can\'t be mapped???\n");
      local_4 = 1;
    }
    else {
      printf("memory mapping is a success.\n");
      if ((local_14b & 1) == 0) {
        if ((local_149 & 1) == 0) {
          if ((local_14a & 1) == 0) {
            local_160 = (long)__addr + 0x24;
            bVar1 = binary_fuse8_contain
                              ((uint64_t)in_stack_fffffffffffffdf0,
                               (binary_fuse8_t *)in_stack_fffffffffffffde8);
            if (bVar1) {
              printf("Probably in the set.\n");
            }
            else {
              printf("Surely not in the set.\n");
            }
          }
          else {
            local_188 = (long)__addr + 0x24;
            bVar1 = binary_fuse16_contain
                              ((uint64_t)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
            if (bVar1) {
              printf("Probably in the set.\n");
            }
            else {
              printf("Surely not in the set.\n");
            }
          }
        }
        else {
          bVar1 = xor8_contain((uint64_t)in_stack_fffffffffffffdf0,
                               (xor8_t *)in_stack_fffffffffffffde8);
          if (bVar1) {
            printf("Probably in the set.\n");
          }
          else {
            printf("Surely not in the set.\n");
          }
        }
      }
      else {
        MappeableBloomFilter<12>::MappeableBloomFilter
                  ((MappeableBloomFilter<12> *)
                   CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                   (size_t)in_stack_fffffffffffffdd8,
                   CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                   (uint64_t *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        bVar1 = MappeableBloomFilter<12>::Contain
                          (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
        if (bVar1) {
          printf("Probably in the set.\n");
        }
        else {
          printf("Surely not in the set.\n");
        }
      }
      cVar9 = clock();
      printf("Processing time %.3f microseconds.\n",
             ((double)(cVar9 - local_140) * 1000.0 * 1000.0) / 1000000.0);
      printf("Expected number of queries per second: %.3f \n",
             (double)(1e+06 / (float)(cVar9 - local_140)));
      munmap(__addr,local_158);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
  int c;
  bool shaourinput = false;
  while ((c = getopt(argc, argv, "hs")) != -1)
    switch (c) {
    case 'h':
      printusage(argv[0]);
      return 0;
    case 's':
      shaourinput = true;
      break;
    default:
      printusage(argv[0]);
      return 0;
    }
  if (optind + 1 >= argc) {
    printusage(argv[0]);
    return -1;
  }
  const char *filename = argv[optind];
  printf("using database: %s\n", filename);
  uint64_t hexval;
  if (shaourinput) {
    printf("We are going to hash your input.\n");
    sha1::SHA1 s;
    const char *tobehashed = argv[optind + 1];
    printf("hashing this word: %s (length in bytes = %zu)\n", tobehashed,
           strlen(tobehashed));
    s.processBytes(tobehashed, strlen(tobehashed));
    uint32_t digest[5];
    s.getDigest(digest);
    char tmp[48];
    snprintf(tmp, 45, "%08x %08x %08x %08x %08x", digest[0], digest[1],
             digest[2], digest[3], digest[4]);
    printf("SHA1 hash %s\n", tmp);
    hexval = ((uint64_t)digest[0] << 32) | digest[1];
  } else {
    const char *hashhex = argv[optind + 1];
    if (strlen(hashhex) != 16) {
      printf("bad hex. length is %zu, 16 hexadecimal characters expected.\n", strlen(hashhex));
      printusage(argv[0]);
      return EXIT_FAILURE;
    }
    uint64_t x1 = hex_to_u32_nocheck((const uint8_t *)hashhex);
    uint64_t x2 = hex_to_u32_nocheck((const uint8_t *)hashhex + 4);
    uint64_t x3 = hex_to_u32_nocheck((const uint8_t *)hashhex + 8);
    uint64_t x4 = hex_to_u32_nocheck((const uint8_t *)hashhex + 12);
    if ((x1 | x2 | x3 | x4) > 0xFFFF) {
      printf("bad hex value  %s \n", hashhex);
      return EXIT_FAILURE;
    }
    hexval = (x1 << 48) | (x2 << 32) | (x3 << 16) | x4;
  }
  printf("hexval = 0x%" PRIx64 "\n", hexval);
  uint64_t cookie = 0;

  uint64_t seed = 0;
  uint64_t BlockLength = 0;
  clock_t start = clock();

  // could open the file once (map it), instead of this complicated mess.
  FILE *fp = fopen(filename, "rb");
  if (fp == NULL) {
    printf("Cannot read the input file %s.", filename);
    return EXIT_FAILURE;
  }
  // should be done with an enum:
  bool xor8 = false;
  bool bin16 = false;
  bool bloom12 = false;
  if (fread(&cookie, sizeof(cookie), 1, fp) != 1)
    printf("failed read.\n");
  if (fread(&seed, sizeof(seed), 1, fp) != 1)
    printf("failed read.\n");
  // should be a switch/case.
  if (cookie != 1234569) {
    if(cookie == 1234570) {
      bin16 = true;
    } else  if (cookie == 1234567) {
      xor8 = true;
      if (fread(&BlockLength, sizeof(BlockLength), 1, fp) != 1)
        printf("failed read.\n");

    } else if (cookie == 1234567 + 1) {
      bloom12 = true;
      if (fread(&BlockLength, sizeof(BlockLength), 1, fp) != 1)
        printf("failed read.\n");

    } else {
      printf("Not a filter file. Cookie found: %llu.\n", (long long unsigned int)cookie);
      return EXIT_FAILURE;
    }
  }
  size_t length = 0;
  binary_fuse8_t binfilter;
  binary_fuse16_t binfilter16;

  if (bloom12) {
    length = BlockLength * sizeof(uint64_t) + 3 * sizeof(uint64_t);
  } else if (xor8) {
    length = 3 * BlockLength * sizeof(uint8_t) + 3 * sizeof(uint64_t);
  } else if(bin16) {
    bool isok = true;
    binfilter16.Seed = seed;
    isok &=
        fread(&binfilter16.SegmentLength, sizeof(binfilter16.SegmentLength), 1, fp);
    isok &=
        fread(&binfilter16.SegmentLengthMask, sizeof(binfilter16.SegmentLengthMask), 1, fp);
    isok &=
        fread(&binfilter16.SegmentCount, sizeof(binfilter16.SegmentCount), 1, fp);
    isok &= fread(&binfilter16.SegmentCountLength,
                  sizeof(binfilter16.SegmentCountLength), 1, fp);
    isok &= fread(&binfilter16.ArrayLength, sizeof(binfilter16.ArrayLength), 1, fp);
    if (!isok)
      printf("failed read.\n");
    length =
        sizeof(cookie) + sizeof(binfilter16.Seed) +
        sizeof(binfilter16.SegmentLength) + sizeof(binfilter16.SegmentLengthMask) +
        sizeof(binfilter16.SegmentCount) + sizeof(binfilter16.SegmentCountLength) +
        sizeof(binfilter16.ArrayLength) + sizeof(uint16_t) * binfilter16.ArrayLength;

  } else {
    bool isok = true;
    binfilter.Seed = seed;
    isok &=
        fread(&binfilter.SegmentLength, sizeof(binfilter.SegmentLength), 1, fp);
    isok &=
        fread(&binfilter.SegmentLengthMask, sizeof(binfilter.SegmentLengthMask), 1, fp);
    isok &=
        fread(&binfilter.SegmentCount, sizeof(binfilter.SegmentCount), 1, fp);
    isok &= fread(&binfilter.SegmentCountLength,
                  sizeof(binfilter.SegmentCountLength), 1, fp);
    isok &= fread(&binfilter.ArrayLength, sizeof(binfilter.ArrayLength), 1, fp);
    if (!isok)
      printf("failed read.\n");
    length =
        sizeof(cookie) + sizeof(binfilter.Seed) +
        sizeof(binfilter.SegmentLength) + sizeof(binfilter.SegmentLengthMask) +
        sizeof(binfilter.SegmentCount) + sizeof(binfilter.SegmentCountLength) +
        sizeof(binfilter.ArrayLength) + sizeof(uint8_t) * binfilter.ArrayLength;
  }

  if (bloom12)
    printf("Bloom filter detected.\n");
  else if (xor8)
    printf("Xor filter detected.\n");
  else if(bin16)
    printf("16-bit binary fuse filter detected.\n");
  else
    printf("8-bit binary fuse filter detected.\n");
  fclose(fp);
  int fd = open(filename, O_RDONLY);
  bool shared = false;

  printf("I expect the file to span %zu bytes.\n", length);
// for Linux:
#if defined(__linux__) && defined(USE_POPULATE)
  uint8_t *addr = (uint8_t *)(mmap(
      NULL, length, PROT_READ,
      MAP_FILE | (shared ? MAP_SHARED : MAP_PRIVATE) | MAP_POPULATE, fd, 0));
#else
  uint8_t *addr =
      (uint8_t *)(mmap(NULL, length, PROT_READ,
                       MAP_FILE | (shared ? MAP_SHARED : MAP_PRIVATE), fd, 0));
#endif
  if (addr == MAP_FAILED) {
    printf("Data can't be mapped???\n");
    return EXIT_FAILURE;
  } else {
    printf("memory mapping is a success.\n");
  }
  if (bloom12) {
    MappeableBloomFilter<12> filter(
        BlockLength, seed, (const uint64_t *)(addr + 3 * sizeof(uint64_t)));
    if (filter.Contain(hexval)) {
      printf("Probably in the set.\n");
    } else {
      printf("Surely not in the set.\n");
    }
  } else if (xor8) {
    xor8_t filter;
    filter.seed = seed;
    filter.blockLength = BlockLength;
    filter.fingerprints = addr + 3 * sizeof(uint64_t);
    if (xor8_contain(hexval, &filter)) {
      printf("Probably in the set.\n");
    } else {
      printf("Surely not in the set.\n");
    }
  } else if (bin16) {
    binfilter16.Fingerprints = reinterpret_cast<uint16_t*>(
        addr + sizeof(cookie) + sizeof(binfilter16.Seed) +
        sizeof(binfilter16.SegmentLength) + sizeof(binfilter16.SegmentLengthMask) +
        sizeof(binfilter16.SegmentCount) + sizeof(binfilter16.SegmentCountLength) +
        sizeof(binfilter16.ArrayLength));
    if (binary_fuse16_contain(hexval, &binfilter16)) {
      printf("Probably in the set.\n");
    } else {
      printf("Surely not in the set.\n");
    }
  } else {
    binfilter.Fingerprints =
        addr + sizeof(cookie) + sizeof(binfilter.Seed) +
        sizeof(binfilter.SegmentLength) + sizeof(binfilter.SegmentLengthMask) +
        sizeof(binfilter.SegmentCount) + sizeof(binfilter.SegmentCountLength) +
        sizeof(binfilter.ArrayLength);
    if (binary_fuse8_contain(hexval, &binfilter)) {
      printf("Probably in the set.\n");
    } else {
      printf("Surely not in the set.\n");
    }
  }
  clock_t end = clock();

  printf("Processing time %.3f microseconds.\n",
         (float)(end - start) * 1000.0 * 1000.0 / CLOCKS_PER_SEC);
  printf("Expected number of queries per second: %.3f \n",
         (float)CLOCKS_PER_SEC / (end - start));
  munmap(addr, length);
  return EXIT_SUCCESS;
}